

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

Graph * Omega_h::edges_across_tets(Graph *__return_storage_ptr__,Adj *r2e,Adj *e2r)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int er;
  long lVar5;
  byte bVar6;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_1c9;
  LOs e2er;
  Adj local_1b8;
  Write<int> local_188;
  Write<int> local_178;
  Write<int> ee2e;
  LOs er2r;
  Write<int> local_140;
  Write<int> local_130;
  Write<int> local_120;
  LOs e2ee;
  Read<signed_char> e2er_codes;
  LOs re2e;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  type f;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_c0,
                 ":");
  std::__cxx11::to_string(&local_e0,0x235);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_e0);
  begin_code("edges_across_tets",(char *)local_1b8.super_Graph.a2ab.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_c0);
  Write<int>::Write(&re2e.write_,&(r2e->super_Graph).ab2b.write_);
  Write<int>::Write(&e2er.write_,(Write<int> *)e2r);
  Write<int>::Write(&er2r.write_,&(e2r->super_Graph).ab2b.write_);
  Write<signed_char>::Write(&e2er_codes.write_,&(e2r->codes).write_);
  if (((ulong)e2er.write_.shared_alloc_.alloc & 1) == 0) {
    uVar3 = (e2er.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar3 = (ulong)e2er.write_.shared_alloc_.alloc >> 3;
  }
  Write<int>::Write(&e2ee.write_,&e2er.write_);
  if (((ulong)er2r.write_.shared_alloc_.alloc & 1) == 0) {
    uVar2 = (er2r.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar2 = (ulong)er2r.write_.shared_alloc_.alloc >> 3;
  }
  std::__cxx11::string::string((string *)&local_1b8,"edge edges to edges",(allocator *)&f);
  Write<int>::Write(&ee2e,(LO)(uVar2 >> 2),(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  Write<int>::Write((Write<int> *)&f,&e2er.write_);
  Write<int>::Write(&f.er2r.write_,&er2r.write_);
  Write<signed_char>::Write(&f.e2er_codes.write_,&e2er_codes.write_);
  Write<int>::Write(&f.re2e.write_,&re2e.write_);
  Write<int>::Write(&f.ee2e,&ee2e);
  std::__cxx11::string::string
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_1c9);
  std::operator+(&local_c0,&local_e0,":");
  std::__cxx11::to_string(&local_50,0x54);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 &local_c0,&local_50);
  begin_code("parallel_for",(char *)local_1b8.super_Graph.a2ab.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (1 < (int)(uVar3 >> 2)) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_1b8,(Write<int> *)&f);
    Write<int>::Write(&local_1b8.super_Graph.ab2b.write_,&f.er2r.write_);
    Write<signed_char>::Write(&local_1b8.codes.write_,&f.e2er_codes.write_);
    Write<int>::Write(&local_188,&f.re2e.write_);
    Write<int>::Write(&local_178,&f.ee2e);
    entering_parallel = 0;
    for (uVar2 = 0; uVar2 != ((uVar3 >> 2) + 0xffffffff & 0xffffffff); uVar2 = uVar2 + 1) {
      iVar1 = *(int *)((long)local_1b8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                      uVar2 * 4 + 4);
      for (lVar5 = (long)*(int *)((long)local_1b8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                                 uVar2 * 4); lVar5 < iVar1; lVar5 = lVar5 + 1) {
        bVar6 = *(char *)((long)local_1b8.codes.write_.shared_alloc_.direct_ptr + lVar5) >> 3;
        iVar4 = -1;
        if (bVar6 < 6) {
          iVar4 = *(int *)(&DAT_00377b68 + (ulong)bVar6 * 4);
        }
        *(undefined4 *)((long)local_178.shared_alloc_.direct_ptr + lVar5 * 4) =
             *(undefined4 *)
              ((long)local_188.shared_alloc_.direct_ptr +
              ((long)iVar4 +
              (long)*(int *)((long)local_1b8.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                            lVar5 * 4) * 6) * 4);
      }
    }
    edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&local_1b8);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  Write<int>::Write(&local_120,&e2ee.write_);
  Write<int>::Write(&local_140,&ee2e);
  Read<int>::Read((Read<signed_char> *)&local_130,&local_140);
  Adj::Adj(&local_1b8,(LOs *)&local_120,(LOs *)&local_130);
  Graph::Graph(__return_storage_ptr__,&local_1b8.super_Graph);
  Adj::~Adj(&local_1b8);
  Write<int>::~Write(&local_130);
  Write<int>::~Write(&local_140);
  Write<int>::~Write(&local_120);
  edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&ee2e);
  Write<int>::~Write(&e2ee.write_);
  Write<signed_char>::~Write(&e2er_codes.write_);
  Write<int>::~Write(&er2r.write_);
  Write<int>::~Write(&e2er.write_);
  Write<int>::~Write(&re2e.write_);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

Graph edges_across_tets(Adj const r2e, Adj const e2r) {
  OMEGA_H_TIME_FUNCTION;
  auto const re2e = r2e.ab2b;
  auto const e2er = e2r.a2ab;
  auto const er2r = e2r.ab2b;
  auto const e2er_codes = e2r.codes;
  auto const ne = e2er.size() - 1;
  auto const e2ee = e2er;
  Write<LO> ee2e(er2r.size(), "edge edges to edges");
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const er_begin = e2er[e];
    auto const er_end = e2er[e + 1];
    for (auto er = er_begin; er < er_end; ++er) {
      auto const r = er2r[er];
      auto const e2er_code = e2er_codes[er];
      auto const rre = code_which_down(e2er_code);
      auto const rre_opp = simplex_opposite_template(REGION, EDGE, rre);
      auto const re_begin = r * 6;
      auto const e_opp = re2e[re_begin + rre_opp];
      auto const ee = er;
      ee2e[ee] = e_opp;
    }
  };
  parallel_for(ne, std::move(f));
  return Adj(e2ee, ee2e);
}